

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

void __thiscall
QPDFObjectHandle::pipeContentStreams
          (QPDFObjectHandle *this,Pipeline *p,string *description,string *all_description)

{
  Pipeline *pPVar1;
  bool bVar2;
  QPDFExc *this_00;
  pointer pQVar3;
  QPDFObjectHandle stream;
  LastChar lc;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> streams;
  Pl_Buffer buf;
  QPDFObjectHandle local_158;
  undefined1 local_148 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  Pipeline *local_120;
  char local_118;
  Pipeline *local_110;
  string local_108;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_e8;
  string local_d0;
  QPDFObjGen local_b0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Pl_Buffer local_68;
  
  local_110 = p;
  arrayOrStreamToStreamArray(&local_e8,this,description,all_description);
  Pl_Buffer::Pl_Buffer(&local_68,"concatenated content stream buffer",(Pipeline *)0x0);
  if (local_e8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_e8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar2 = false;
    pQVar3 = local_e8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (pQVar3->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (pQVar3->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_158.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_158.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      if (bVar2) {
        Pipeline::writeCStr(&local_68.super_Pipeline,"\n");
      }
      Pipeline::Pipeline((Pipeline *)local_148,"lastchar",&local_68.super_Pipeline);
      local_148._0_8_ = &PTR__Pipeline_002eeb90;
      local_118 = '\0';
      bVar2 = pipeStreamData(&local_158,(Pipeline *)local_148,0,qpdf_dl_specialized,false,false);
      if (!bVar2) {
        this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"content stream","");
        if (local_158.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0
           ) {
          local_b0.obj = 0;
          local_b0.gen = 0;
        }
        else {
          local_b0 = (local_158.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og;
        }
        QPDFObjGen::unparse_abi_cxx11_(&local_a8,&local_b0,' ');
        std::operator+(&local_88,"content stream object ",&local_a8);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"errors while decoding content stream","");
        QPDFExc::QPDFExc(this_00,qpdf_e_damaged_pdf,&local_108,&local_88,0,&local_d0);
        __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      (*local_120->_vptr_Pipeline[3])();
      bVar2 = local_118 != '\n';
      local_148._0_8_ = &PTR__Pipeline_002eb0c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._8_8_ != &local_130) {
        operator_delete((void *)local_148._8_8_,local_130._M_allocated_capacity + 1);
      }
      if (local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_158.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      pQVar3 = pQVar3 + 1;
    } while (pQVar3 != local_e8.
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  Pl_Buffer::getString_abi_cxx11_((string *)local_148,&local_68);
  pPVar1 = local_110;
  Pipeline::writeString(local_110,(string *)local_148);
  if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  (*pPVar1->_vptr_Pipeline[3])(pPVar1);
  Pl_Buffer::~Pl_Buffer(&local_68);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_e8);
  return;
}

Assistant:

void
QPDFObjectHandle::pipeContentStreams(
    Pipeline* p, std::string const& description, std::string& all_description)
{
    std::vector<QPDFObjectHandle> streams =
        arrayOrStreamToStreamArray(description, all_description);
    bool need_newline = false;
    Pl_Buffer buf("concatenated content stream buffer");
    for (auto stream: streams) {
        if (need_newline) {
            buf.writeCStr("\n");
        }
        LastChar lc(buf);
        if (!stream.pipeStreamData(&lc, 0, qpdf_dl_specialized)) {
            QTC::TC("qpdf", "QPDFObjectHandle errors in parsecontent");
            throw QPDFExc(
                qpdf_e_damaged_pdf,
                "content stream",
                "content stream object " + stream.getObjGen().unparse(' '),
                0,
                "errors while decoding content stream");
        }
        lc.finish();
        need_newline = (lc.getLastChar() != static_cast<unsigned char>('\n'));
        QTC::TC("qpdf", "QPDFObjectHandle need_newline", need_newline ? 0 : 1);
    }
    p->writeString(buf.getString());
    p->finish();
}